

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp.c
# Opt level: O1

c_int osqp_update_eps_abs(OSQPWorkspace *work,c_float eps_abs_new)

{
  c_int cVar1;
  
  if (work == (OSQPWorkspace *)0x0) {
    cVar1 = _osqp_error(OSQP_WORKSPACE_NOT_INIT_ERROR,"osqp_update_eps_abs");
    return cVar1;
  }
  if (eps_abs_new < 0.0) {
    printf("ERROR in %s: ","osqp_update_eps_abs");
    printf("eps_abs must be nonnegative");
    putchar(10);
    return 1;
  }
  work->settings->eps_abs = eps_abs_new;
  return 0;
}

Assistant:

c_int osqp_update_eps_abs(OSQPWorkspace *work, c_float eps_abs_new) {

  // Check if workspace has been initialized
  if (!work) return osqp_error(OSQP_WORKSPACE_NOT_INIT_ERROR);

  // Check that eps_abs is positive
  if (eps_abs_new < 0.) {
#ifdef PRINTING
    c_eprint("eps_abs must be nonnegative");
#endif /* ifdef PRINTING */
    return 1;
  }

  // Update eps_abs
  work->settings->eps_abs = eps_abs_new;

  return 0;
}